

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permutations.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
wasm::makeReversed(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
                  vector<unsigned_int,_std::allocator<unsigned_int>_> *original)

{
  size_type __new_size;
  reference pvVar1;
  undefined4 local_38;
  Index i;
  size_type num;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *original_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ret;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  __new_size = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(original);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (__return_storage_ptr__,__new_size);
  for (local_38 = 0; local_38 < __new_size; local_38 = local_38 + 1) {
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (original,(ulong)local_38);
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (__return_storage_ptr__,(ulong)*pvVar1);
    *pvVar1 = local_38;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<Index> makeReversed(std::vector<Index>& original) {
  std::vector<Index> ret;
  auto num = original.size();
  ret.resize(num);
  for (Index i = 0; i < num; i++) {
    ret[original[i]] = i;
  }
  return ret;
}